

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

void leaveblock(FuncState *fs)

{
  byte bVar1;
  int iVar2;
  BlockCnt *pBVar3;
  FuncState *pFVar4;
  LocVar *pLVar5;
  long lVar6;
  FuncState *fs_1;
  ulong uVar7;
  
  pBVar3 = fs->bl;
  fs->bl = pBVar3->previous;
  bVar1 = pBVar3->nactvar;
  pFVar4 = fs->ls->fs;
  uVar7 = (ulong)pFVar4->nactvar;
  if (bVar1 < pFVar4->nactvar) {
    iVar2 = pFVar4->pc;
    pLVar5 = pFVar4->f->locvars;
    do {
      lVar6 = uVar7 + 0x3b;
      uVar7 = uVar7 - 1;
      pLVar5[*(ushort *)&pFVar4->upvalues[lVar6].info].endpc = iVar2;
    } while ((uint)bVar1 < uVar7);
    pFVar4->nactvar = (lu_byte)uVar7;
  }
  if (pBVar3->upval != '\0') {
    luaK_codeABC(fs,OP_CLOSE,(uint)bVar1,0,0);
  }
  fs->freereg = (uint)fs->nactvar;
  luaK_patchtohere(fs,pBVar3->breaklist);
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  fs->bl = bl->previous;
  removevars(fs->ls, bl->nactvar);
  if (bl->upval)
    luaK_codeABC(fs, OP_CLOSE, bl->nactvar, 0, 0);
  /* a block either controls scope or breaks (never both) */
  lua_assert(!bl->isbreakable || !bl->upval);
  lua_assert(bl->nactvar == fs->nactvar);
  fs->freereg = fs->nactvar;  /* free registers */
  luaK_patchtohere(fs, bl->breaklist);
}